

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-imgui.cc
# Opt level: O1

void __thiscall HostUI::event(HostUI *this,SDL_Event *event)

{
  Uint32 UVar1;
  ImGuiIO *pIVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int display_h;
  int display_w;
  int ih;
  int iw;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  pIVar2 = ImGui::GetIO();
  UVar1 = event->type;
  if ((int)UVar1 < 0x303) {
    if (UVar1 - 0x300 < 2) {
      pIVar2->KeysDown[(event->display).data1] = UVar1 == 0x300;
      uVar3 = SDL_GetModState();
      pIVar2->KeyShift = (uVar3 & 3) != 0;
      uVar3 = SDL_GetModState();
      pIVar2->KeyCtrl = (uVar3 & 0xc0) != 0;
      uVar3 = SDL_GetModState();
      pIVar2->KeyAlt = (uVar3 & 0x300) != 0;
      uVar3 = SDL_GetModState();
      pIVar2->KeySuper = (uVar3 & 0xc00) != 0;
    }
    else if ((UVar1 == 0x200) &&
            (((event->display).event == '\x06' || ((event->display).event == '\x01')))) {
      pIVar2 = ImGui::GetIO();
      SDL_GetWindowSize(this->window,&local_34,&local_38);
      fVar4 = (float)local_34;
      fVar5 = (float)local_38;
      SDL_GL_GetDrawableSize(this->window,&local_3c,&local_40);
      (pIVar2->DisplaySize).x = fVar4;
      (pIVar2->DisplaySize).y = fVar5;
      fVar6 = (float)local_3c / fVar4;
      if (local_34 < 1) {
        fVar6 = 0.0;
      }
      fVar7 = (float)local_40 / fVar5;
      if (local_38 < 1) {
        fVar7 = 0.0;
      }
      (pIVar2->DisplayFramebufferScale).x = fVar6;
      (pIVar2->DisplayFramebufferScale).y = fVar7;
      this->proj_matrix[0] = 0.0;
      this->proj_matrix[1] = 0.0;
      this->proj_matrix[2] = 0.0;
      this->proj_matrix[3] = 0.0;
      this->proj_matrix[4] = 0.0;
      this->proj_matrix[5] = 0.0;
      this->proj_matrix[6] = 0.0;
      this->proj_matrix[7] = 0.0;
      this->proj_matrix[0] = (f32)(2.0 / fVar4);
      this->proj_matrix[4] = (f32)(-2.0 / fVar5);
      this->proj_matrix[6] = -1.0;
      this->proj_matrix[7] = 1.0;
      this->proj_matrix[8] = 1.0;
    }
  }
  else {
    if (UVar1 == 0x303) {
      ImGuiIO::AddInputCharactersUTF8(pIVar2,(event->edit).text);
      return;
    }
    if (UVar1 == 0x401) {
      if ((event->edit).text[4] == '\x01') {
        this->mouse_pressed[0] = 1.0;
      }
      if ((event->edit).text[4] == '\x03') {
        this->mouse_pressed[1] = 1.0;
      }
      if ((event->edit).text[4] == '\x02') {
        this->mouse_pressed[2] = 1.0;
      }
    }
    else if (UVar1 == 0x403) {
      if (0 < (event->window).data2) {
        this->mouse_wheel = 1.0;
      }
      if ((event->window).data2 < 0) {
        this->mouse_wheel = -1.0;
      }
    }
  }
  return;
}

Assistant:

void HostUI::event(union SDL_Event* event) {
  ImGuiIO& io = ImGui::GetIO();
  switch (event->type) {
    case SDL_WINDOWEVENT:
      switch (event->window.event) {
        case SDL_WINDOWEVENT_SHOWN:
        case SDL_WINDOWEVENT_SIZE_CHANGED: {
          ImGuiIO& io = ImGui::GetIO();

          int iw, ih;
          SDL_GetWindowSize(window, &iw, &ih);
          f32 w = iw, h = ih;
          int display_w, display_h;
          SDL_GL_GetDrawableSize(window, &display_w, &display_h);
          io.DisplaySize = ImVec2(w, h);
          io.DisplayFramebufferScale =
              ImVec2(w > 0 ? (display_w / w) : 0, h > 0 ? (display_h / h) : 0);

          memset(proj_matrix, 0, sizeof(proj_matrix));
          proj_matrix[0] = 2.0f / w;
          proj_matrix[4] = -2.0f / h;
          proj_matrix[6] = -1.0f;
          proj_matrix[7] = 1.0f;
          proj_matrix[8] = 1.0f;
          break;
        }
      }
      break;
    case SDL_MOUSEWHEEL:
      if (event->wheel.y > 0) mouse_wheel = 1;
      if (event->wheel.y < 0) mouse_wheel = -1;
      break;
    case SDL_MOUSEBUTTONDOWN:
      if (event->button.button == SDL_BUTTON_LEFT) mouse_pressed[0] = true;
      if (event->button.button == SDL_BUTTON_RIGHT) mouse_pressed[1] = true;
      if (event->button.button == SDL_BUTTON_MIDDLE) mouse_pressed[2] = true;
      break;
    case SDL_TEXTINPUT:
      io.AddInputCharactersUTF8(event->text.text);
      break;
    case SDL_KEYDOWN:
    case SDL_KEYUP: {
      int key = event->key.keysym.scancode;
      io.KeysDown[key] = (event->type == SDL_KEYDOWN);
      io.KeyShift = ((SDL_GetModState() & KMOD_SHIFT) != 0);
      io.KeyCtrl = ((SDL_GetModState() & KMOD_CTRL) != 0);
      io.KeyAlt = ((SDL_GetModState() & KMOD_ALT) != 0);
      io.KeySuper = ((SDL_GetModState() & KMOD_GUI) != 0);
      break;
    }
  }
}